

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  pointer pSVar1;
  bool bVar2;
  List *__range1;
  ScopePool *funcScope;
  pointer pSVar3;
  
  pSVar1 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->FunctionScopes).
                super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    bVar2 = ScopePool::IsAlreadyLocked(pSVar3,filename);
    if (bVar2) {
      return true;
    }
  }
  pSVar3 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pSVar3 == pSVar1) {
      bVar2 = ScopePool::IsAlreadyLocked(&this->ProcessScope,filename);
      return bVar2;
    }
    bVar2 = ScopePool::IsAlreadyLocked(pSVar3,filename);
    if (bVar2) break;
    pSVar3 = pSVar3 + 1;
  }
  return true;
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (auto const& funcScope : this->FunctionScopes) {
    const bool result = funcScope.IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (auto const& fileScope : this->FileScopes) {
    const bool result = fileScope.IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}